

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_gemv_square_LDSame<double,double,(char)84>(void)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  quaternion<double> *x;
  pointer pqVar9;
  pointer pqVar10;
  result_type_conflict1 rVar11;
  result_type_conflict1 rVar12;
  result_type_conflict1 rVar13;
  result_type_conflict1 rVar14;
  double ALPHA;
  double BETA;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  quaternion<double> local_310;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  undefined1 local_288 [8];
  undefined8 local_280;
  shared_count sStack_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  undefined **local_218;
  undefined1 local_210;
  undefined8 *local_208;
  char **local_200;
  quaternion<double> __r;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  for (pqVar10 = X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pqVar9 = Y.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pqVar10 !=
      X.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar10 = pqVar10 + 1) {
    rVar11 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar12 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar13 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar14 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar10->_M_real = rVar11;
    pqVar10->_M_imag_i = rVar12;
    pqVar10->_M_imag_j = rVar13;
    pqVar10->_M_imag_k = rVar14;
  }
  for (; pqVar10 = A.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      pqVar9 != Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar9 = pqVar9 + 1) {
    rVar11 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar12 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar13 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar14 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar9->_M_real = rVar11;
    pqVar9->_M_imag_i = rVar12;
    pqVar9->_M_imag_j = rVar13;
    pqVar9->_M_imag_k = rVar14;
  }
  for (; pqVar10 !=
         A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish; pqVar10 = pqVar10 + 1) {
    rVar11 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar12 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar13 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar14 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar10->_M_real = rVar11;
    pqVar10->_M_imag_i = rVar12;
    pqVar10->_M_imag_j = rVar13;
    pqVar10->_M_imag_k = rVar14;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&YC,&Y);
  ALPHA = genRandom<double>();
  BETA = genRandom<double>();
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar6 = std::operator<<(local_1a8,"hblas2_gemv_square_");
  std::operator<<(poVar6,'T');
  std::operator<<(local_1a8,"R");
  std::operator<<(local_1a8,"R");
  std::operator<<(local_1a8,"_LDSame");
  std::__cxx11::stringbuf::str();
  poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_310);
  poVar6 = std::operator<<(poVar6," will use");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&local_310);
  std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  poVar6 = std::ostream::_M_insert<double>(ALPHA);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator<<((ostream *)&std::cout,"  BETA = ");
  poVar6 = std::ostream::_M_insert<double>(BETA);
  std::endl<char,std::char_traits<char>>(poVar6);
  HAXX::HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,double,double>
            ('T',100,100,ALPHA,
             A.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,
             X.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,BETA,
             Y.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1);
  lVar7 = 0;
  for (lVar8 = 0; lVar8 != 320000; lVar8 = lVar8 + 0xc80) {
    HAXX::HBLAS_DOTUV<double>
              (&local_310,100,
               (quaternion<double> *)
               ((long)&(A.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar8),1,
               X.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1);
    dVar5 = local_310._M_imag_k;
    dVar4 = local_310._M_imag_j;
    dVar3 = local_310._M_imag_i;
    dVar2 = local_310._M_real;
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_238 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x47,&local_250);
    pdVar1 = (double *)
             ((long)&(YC.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar7);
    __r._M_real = dVar2 * ALPHA + BETA * *pdVar1;
    __r._M_imag_i = dVar3 * ALPHA + BETA * pdVar1[1];
    __r._M_imag_j = dVar4 * ALPHA + BETA * pdVar1[2];
    __r._M_imag_k = dVar5 * ALPHA + BETA * pdVar1[3];
    HAXX::inv<double>(&local_1d8,
                      (quaternion<double> *)
                      ((long)&(Y.
                               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar7));
    HAXX::operator*(&local_310,&__r,&local_1d8);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_310._M_imag_i;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_310._M_imag_j;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_310._M_imag_k;
    local_210 = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (local_310._M_real + -1.0) * (local_310._M_real + -1.0);
    auVar15 = vfmadd231sd_fma(auVar18,auVar15,auVar15);
    auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
    auVar15 = vfmadd231sd_fma(auVar15,auVar17,auVar17);
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    local_288[0] = auVar15._0_8_ < 1e-12;
    local_280 = 0;
    sStack_278.pi_ = (sp_counted_base *)0x0;
    local_260 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_258 = "";
    local_218 = &PTR__lazy_ostream_00219908;
    local_208 = &boost::unit_test::lazy_ostream::inst;
    local_200 = &local_260;
    local_270 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_268 = "";
    boost::test_tools::tt_detail::report_assertion(local_288,&local_218,&local_270,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_278);
    lVar7 = lVar7 + 0x20;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&YC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}